

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O3

void Abc_NtkCollectNonOverlapCands
               (Abc_Obj_t *pLut,Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,Vec_Ptr_t *vCands,
               Nwk_LMPars_t *pPars)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  void **ppvVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int Fill;
  int iVar12;
  Abc_Obj_t *extraout_RDX;
  Abc_Obj_t *extraout_RDX_00;
  Abc_Obj_t *pAVar13;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  Vec_Ptr_t *vNext_00;
  long lVar17;
  
  vCands->nSize = 0;
  if (1 < pPars->nMaxSuppSize - (pLut->vFanins).nSize) {
    if (pPars->nMaxDistance < 1) {
      __assert_fail("pPars->nMaxDistance > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMerge.c"
                    ,0x98,
                    "void Abc_NtkCollectNonOverlapCands(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Nwk_LMPars_t *)"
                   );
    }
    vStart->nSize = 0;
    iVar14 = 0;
    ppvVar7 = vStart->pArray;
    if (vStart->nCap == 0) {
      if (ppvVar7 == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
        iVar14 = 0;
      }
      else {
        ppvVar7 = (void **)realloc(ppvVar7,0x80);
        iVar14 = vStart->nSize;
      }
      vStart->pArray = ppvVar7;
      vStart->nCap = 0x10;
    }
    vStart->nSize = iVar14 + 1;
    ppvVar7[iVar14] = pLut;
    pAVar1 = pLut->pNtk;
    pAVar13 = pLut;
    if ((pAVar1->vTravIds).pArray == (int *)0x0) {
      iVar14 = pAVar1->vObjs->nSize;
      uVar16 = (long)iVar14 + 500;
      iVar12 = (int)uVar16;
      if ((pAVar1->vTravIds).nCap < iVar12) {
        piVar8 = (int *)malloc(uVar16 * 4);
        (pAVar1->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_002de40d;
        (pAVar1->vTravIds).nCap = iVar12;
        pAVar13 = extraout_RDX;
      }
      else {
        piVar8 = (int *)0x0;
      }
      if (-500 < iVar14) {
        memset(piVar8,0,(uVar16 & 0xffffffff) << 2);
        pAVar13 = extraout_RDX_00;
      }
      (pAVar1->vTravIds).nSize = iVar12;
    }
    iVar12 = pAVar1->nTravIds;
    iVar14 = iVar12 + 1;
    pAVar1->nTravIds = iVar14;
    if (0x3ffffffe < iVar12) {
LAB_002de3b0:
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    iVar12 = pLut->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,iVar12 + 1,(int)pAVar13);
    if (((long)iVar12 < 0) || ((pAVar1->vTravIds).nSize <= iVar12)) goto LAB_002de391;
    (pAVar1->vTravIds).pArray[iVar12] = iVar14;
    iVar14 = extraout_EDX;
    if (0 < pPars->nMaxDistance) {
      iVar12 = 1;
      do {
        vNext_00 = vNext;
        Abc_NtkCollectCircle(vStart,vNext_00,pPars->nMaxFanout);
        iVar14 = extraout_EDX_00;
        if (0 < vNext_00->nSize) {
          uVar16 = (ulong)(uint)vCands->nCap;
          iVar9 = vCands->nSize;
          lVar17 = 0;
          do {
            pvVar2 = vNext_00->pArray[lVar17];
            iVar14 = (int)uVar16;
            if (iVar9 == iVar14) {
              if (iVar14 < 0x10) {
                if (vCands->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vCands->pArray,0x80);
                }
                vCands->pArray = ppvVar7;
                vCands->nCap = 0x10;
                uVar16 = 0x10;
              }
              else {
                uVar16 = (ulong)(uint)(iVar14 * 2);
                if (vCands->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(uVar16 * 8);
                }
                else {
                  ppvVar7 = (void **)realloc(vCands->pArray,uVar16 * 8);
                }
                vCands->pArray = ppvVar7;
                vCands->nCap = iVar14 * 2;
              }
            }
            else {
              ppvVar7 = vCands->pArray;
            }
            iVar14 = vCands->nSize;
            iVar9 = iVar14 + 1;
            vCands->nSize = iVar9;
            ppvVar7[iVar14] = pvVar2;
            lVar17 = lVar17 + 1;
          } while (lVar17 < vNext_00->nSize);
        }
        bVar5 = iVar12 < pPars->nMaxDistance;
        vNext = vStart;
        vStart = vNext_00;
        iVar12 = iVar12 + 1;
      } while (bVar5);
    }
    pAVar1 = pLut->pNtk;
    if ((pAVar1->vTravIds).pArray == (int *)0x0) {
      iVar12 = pAVar1->vObjs->nSize;
      uVar16 = (long)iVar12 + 500;
      iVar9 = (int)uVar16;
      if ((pAVar1->vTravIds).nCap < iVar9) {
        piVar8 = (int *)malloc(uVar16 * 4);
        (pAVar1->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_002de40d:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar1->vTravIds).nCap = iVar9;
        iVar14 = extraout_EDX_01;
      }
      else {
        piVar8 = (int *)0x0;
      }
      if (-500 < iVar12) {
        memset(piVar8,0,(uVar16 & 0xffffffff) << 2);
        iVar14 = extraout_EDX_02;
      }
      (pAVar1->vTravIds).nSize = iVar9;
    }
    iVar12 = pAVar1->nTravIds;
    pAVar1->nTravIds = iVar12 + 1;
    if (0x3ffffffe < iVar12) goto LAB_002de3b0;
    iVar9 = pPars->fUseTfiTfo;
    uVar15 = pLut->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,uVar15 + 1,iVar14);
    if (iVar9 == 0) {
      if (((int)uVar15 < 0) || ((pAVar1->vTravIds).nSize <= (int)uVar15)) {
LAB_002de391:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar1->vTravIds).pArray[uVar15] = iVar12;
      Abc_NtkMarkFanins_rec(pLut,(*(uint *)&pLut->field_0x14 >> 0xc) - pPars->nMaxDistance);
      pAVar1 = pLut->pNtk;
      iVar14 = pLut->Id;
      iVar12 = pAVar1->nTravIds;
      Vec_IntFillExtra(&pAVar1->vTravIds,iVar14 + 1,Fill);
      if (((long)iVar14 < 0) || ((pAVar1->vTravIds).nSize <= iVar14)) goto LAB_002de391;
      (pAVar1->vTravIds).pArray[iVar14] = iVar12 + -1;
      Abc_NtkMarkFanouts_rec
                (pLut,(*(uint *)&pLut->field_0x14 >> 0xc) + pPars->nMaxDistance,pPars->nMaxFanout);
      uVar16 = extraout_RDX_02;
    }
    else {
      if (((int)uVar15 < 0) || ((pAVar1->vTravIds).nSize <= (int)uVar15)) goto LAB_002de391;
      (pAVar1->vTravIds).pArray[uVar15] = iVar12 + 1;
      uVar16 = extraout_RDX_01;
    }
    iVar14 = vCands->nSize;
    if (iVar14 < 1) {
      uVar15 = 0;
    }
    else {
      lVar17 = 0;
      uVar15 = 0;
      do {
        plVar3 = (long *)vCands->pArray[lVar17];
        lVar4 = *plVar3;
        iVar14 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar14 + 1,(int)uVar16);
        if (((long)iVar14 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = extraout_RDX_03;
        if (((*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar14 * 4) != *(int *)(*plVar3 + 0xd8)) &&
            (*(int *)((long)plVar3 + 0x1c) + (pLut->vFanins).nSize <= pPars->nMaxSuppSize)) &&
           (uVar6 = *(uint *)&pLut->field_0x14 >> 0xc,
           uVar10 = *(uint *)((long)plVar3 + 0x14) >> 0xc, iVar12 = uVar6 - uVar10,
           iVar14 = pPars->nMaxLevelDiff,
           uVar16 = (ulong)CONCAT31((int3)((uint)iVar12 >> 8),iVar14 < iVar12),
           (int)(uVar10 - uVar6) <= iVar14 && iVar14 >= iVar12)) {
          if (((int)uVar15 < 0) || (vCands->nSize <= (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar11 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          vCands->pArray[uVar11] = plVar3;
        }
        lVar17 = lVar17 + 1;
        iVar14 = vCands->nSize;
      } while (lVar17 < iVar14);
    }
    if (iVar14 < (int)uVar15) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vCands->nSize = uVar15;
  }
  return;
}

Assistant:

void Abc_NtkCollectNonOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Vec_Ptr_t * vTemp;
    Abc_Obj_t * pObj;
    int i, k;
    Vec_PtrClear( vCands );
    if ( pPars->nMaxSuppSize - Abc_ObjFaninNum(pLut) <= 1 )
        return;

    // collect nodes removed by this distance
    assert( pPars->nMaxDistance > 0 );
    Vec_PtrClear( vStart );
    Vec_PtrPush( vStart, pLut );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    for ( i = 1; i <= pPars->nMaxDistance; i++ )
    {
        Abc_NtkCollectCircle( vStart, vNext, pPars->nMaxFanout );
        vTemp  = vStart;
        vStart = vNext;
        vNext  = vTemp;
        // collect the nodes in vStart
        Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, k )
            Vec_PtrPush( vCands, pObj );
    }

    // mark the TFI/TFO nodes
    Abc_NtkIncrementTravId( pLut->pNtk );
    if ( pPars->fUseTfiTfo )
        Abc_NodeSetTravIdCurrent( pLut );
    else
    {
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanins_rec( pLut, Abc_ObjLevel(pLut) - pPars->nMaxDistance );
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanouts_rec( pLut, Abc_ObjLevel(pLut) + pPars->nMaxDistance, pPars->nMaxFanout );
    }

    // collect nodes satisfying the following conditions:
    // - they are close enough in terms of distance
    // - they are not in the TFI/TFO of the LUT
    // - they have no more than the given number of fanins
    // - they have no more than the given diff in delay
    k = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCands, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pLut) + Abc_ObjFaninNum(pObj) > pPars->nMaxSuppSize )
            continue;
        if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
             Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
             continue;
        Vec_PtrWriteEntry( vCands, k++, pObj );
    }
    Vec_PtrShrink( vCands, k );
}